

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

string_view bloaty::ReadBytes(size_t bytes,string_view *data)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  
  if (bytes <= data->_M_len) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr(data,0,bytes);
    data->_M_str = data->_M_str + bytes;
    data->_M_len = data->_M_len - bytes;
    sVar2._M_len = bVar1._M_len;
    sVar2._M_str = bVar1._M_str;
    return sVar2;
  }
  Throw("premature EOF reading variable-length DWARF data",0xad);
}

Assistant:

inline std::string_view ReadBytes(size_t bytes, std::string_view* data) {
  if (data->size() < bytes) {
    THROW("premature EOF reading variable-length DWARF data");
  }
  std::string_view ret = data->substr(0, bytes);
  data->remove_prefix(bytes);
  return ret;
}